

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O2

void __thiscall amrex::Amr::restart(Amr *this,string *filename)

{
  undefined1 *puVar1;
  ulong *puVar2;
  Real *pRVar3;
  double *pdVar4;
  undefined8 *puVar5;
  double dVar6;
  pointer pGVar7;
  undefined8 uVar8;
  pointer piVar9;
  pointer piVar10;
  pointer piVar11;
  pointer pdVar12;
  pointer pdVar13;
  pointer puVar14;
  tuple<amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_> tVar15;
  byte bVar16;
  Real RVar17;
  char cVar18;
  __type _Var19;
  bool bVar20;
  ostream *poVar21;
  mapped_type *charBuf;
  long lVar22;
  Print *pPVar23;
  __uniq_ptr_data<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>,_true,_true> _Var24;
  long lVar25;
  int i;
  long lVar26;
  int i_9;
  int iVar27;
  int i_2;
  int iVar28;
  ulong uVar29;
  string *psVar30;
  int lev_1;
  int i_17;
  int mx_lev;
  char local_479;
  string *local_478;
  int spdim;
  int int_dummy;
  string faHeaderFullName;
  string first_line;
  IO_Buffer io_buffer;
  Real real_dummy;
  int iStack_400;
  int iStack_3fc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_3f8;
  double local_3e8;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> inputs_domain;
  string fileCharPtrString;
  string File;
  Vector<char,_std::allocator<char>_> fileCharPtr;
  int linit;
  MPI_Comm MStack_364;
  uint uStack_360;
  undefined4 uStack_35c;
  ostream aoStack_358 [376];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>_>_>_>
  faHeaderMap;
  istringstream is;
  byte abStack_190 [352];
  
  this->which_level_being_advanced = -1;
  local_478 = filename;
  local_3e8 = second();
  VisMF::SetMFFileInStreams((anonymous_namespace)::mffile_nstreams,ParallelDescriptor::m_comm);
  if (0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose) {
    poVar21 = OutStream();
    Print::Print((Print *)&linit,poVar21);
    std::operator<<(aoStack_358,"restarting calculation from file: ");
    std::operator<<(aoStack_358,(string *)local_478);
    std::operator<<(aoStack_358,"\n");
    Print::~Print((Print *)&linit);
  }
  if ((this->record_run_info != 0) && (*(int *)(ParallelContext::frames + 0xc) == 0)) {
    poVar21 = std::operator<<((ostream *)&this->runlog,"RESTART from file = ");
    poVar21 = std::operator<<(poVar21,(string *)local_478);
    std::operator<<(poVar21,'\n');
  }
  if ((this->probin_file)._M_string_length != 0) {
    _linit = _linit & 0xffffffff00000000;
    readProbinFile(this,&linit);
  }
  if ((this->record_run_info != 0) && (*(int *)(ParallelContext::frames + 0xc) == 0)) {
    poVar21 = std::operator<<((ostream *)&this->runlog,"RESTART from file = ");
    poVar21 = std::operator<<(poVar21,(string *)local_478);
    std::operator<<(poVar21,'\n');
  }
  faHeaderMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &faHeaderMap._M_t._M_impl.super__Rb_tree_header._M_header;
  faHeaderMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  faHeaderMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  faHeaderMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  faHeaderMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       faHeaderMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((anonymous_namespace)::prereadFAHeaders == '\x01') {
    std::operator+(&File,local_478,"/FabArrayHeaders.txt");
    io_buffer.super_vector<char,_std::allocator<char>_>.
    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    io_buffer.super_vector<char,_std::allocator<char>_>.
    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    io_buffer.super_vector<char,_std::allocator<char>_>.
    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    _linit = CONCAT44(MStack_364,ParallelDescriptor::m_comm);
    ParallelDescriptor::ReadAndBcastFile(&File,&io_buffer,false,&linit);
    if (io_buffer.super_vector<char,_std::allocator<char>_>.
        super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish !=
        io_buffer.super_vector<char,_std::allocator<char>_>.
        super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start &&
        -1 < (long)io_buffer.super_vector<char,_std::allocator<char>_>.
                   super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                   _M_finish -
             (long)io_buffer.super_vector<char,_std::allocator<char>_>.
                   super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                   _M_start) {
      std::__cxx11::string::string
                ((string *)&fileCharPtrString,
                 io_buffer.super_vector<char,_std::allocator<char>_>.
                 super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                 _M_start,(allocator *)&linit);
      std::__cxx11::istringstream::istringstream
                ((istringstream *)&is,(string *)&fileCharPtrString,_S_in);
      while ((abStack_190[*(long *)(_is + -0x18)] & 2) == 0) {
        first_line._M_dataplus._M_p = (pointer)&first_line.field_2;
        first_line._M_string_length = 0;
        first_line.field_2._M_local_buf[0] = '\0';
        std::operator>>((istream *)&is,(string *)&first_line);
        if ((abStack_190[*(long *)(_is + -0x18)] & 2) == 0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &real_dummy,local_478,'/');
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&linit
                         ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &real_dummy,&first_line);
          std::operator+(&faHeaderFullName,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&linit
                         ,"_H");
          std::__cxx11::string::~string((string *)&linit);
          std::__cxx11::string::~string((string *)&real_dummy);
          charBuf = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>_>_>_>
                    ::operator[](&faHeaderMap,&faHeaderFullName);
          _linit = CONCAT44(MStack_364,ParallelDescriptor::m_comm);
          ParallelDescriptor::ReadAndBcastFile(&faHeaderFullName,charBuf,true,(MPI_Comm *)&linit);
          if (2 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose) {
            poVar21 = OutStream();
            Print::Print((Print *)&linit,poVar21);
            std::operator<<(aoStack_358,":::: faHeaderName faHeaderFullName tempCharArray.size() = "
                           );
            std::operator<<(aoStack_358,(string *)&first_line);
            std::operator<<(aoStack_358,"  ");
            std::operator<<(aoStack_358,(string *)&faHeaderFullName);
            std::operator<<(aoStack_358,"  ");
            std::ostream::_M_insert<long>((long)aoStack_358);
            std::operator<<(aoStack_358,"\n");
            Print::~Print((Print *)&linit);
          }
          std::__cxx11::string::~string((string *)&faHeaderFullName);
        }
        std::__cxx11::string::~string((string *)&first_line);
      }
      StateData::faHeaderMap_abi_cxx11_ = &faHeaderMap;
      std::__cxx11::istringstream::~istringstream((istringstream *)&is);
      std::__cxx11::string::~string((string *)&fileCharPtrString);
    }
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              ((_Vector_base<char,_std::allocator<char>_> *)&io_buffer);
    std::__cxx11::string::~string((string *)&File);
  }
  std::operator+(&File,local_478,"/Header");
  std::vector<char,_std::allocator<char>_>::vector
            (&io_buffer.super_vector<char,_std::allocator<char>_>,VisMFBuffer::ioBufferSize,
             (allocator_type *)&linit);
  fileCharPtr.super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  fileCharPtr.super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  fileCharPtr.super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  _linit = CONCAT44(MStack_364,ParallelDescriptor::m_comm);
  ParallelDescriptor::ReadAndBcastFile(&File,&fileCharPtr,true,&linit);
  std::__cxx11::string::string
            ((string *)&fileCharPtrString,
             fileCharPtr.super_vector<char,_std::allocator<char>_>.
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start,(allocator *)&linit);
  std::__cxx11::istringstream::istringstream
            ((istringstream *)&is,(string *)&fileCharPtrString,_S_in);
  first_line._M_dataplus._M_p = (pointer)&first_line.field_2;
  first_line._M_string_length = 0;
  first_line.field_2._M_local_buf[0] = '\0';
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&is,(string *)&first_line);
  _Var19 = std::operator==(&first_line,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (anonymous_namespace)::CheckPointVersion_abi_cxx11_);
  if (_Var19) {
    std::istream::operator>>((istream *)&is,&spdim);
  }
  else {
    spdim = atoi(first_line._M_dataplus._M_p);
  }
  if (spdim != 3) {
    poVar21 = ErrorStream();
    poVar21 = std::operator<<(poVar21,"Amr::restart(): bad spacedim = ");
    poVar21 = (ostream *)std::ostream::operator<<(poVar21,spdim);
    std::operator<<(poVar21,'\n');
    Abort_host((char *)0x0);
  }
  std::istream::_M_extract<double>((double *)&is);
  std::istream::operator>>((istream *)&is,&mx_lev);
  puVar1 = &(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
  std::istream::operator>>((istream *)&is,(int *)puVar1);
  std::vector<amrex::Box,_std::allocator<amrex::Box>_>::vector
            (&inputs_domain.super_vector<amrex::Box,_std::allocator<amrex::Box>_>,
             (long)(this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level + 1,
             (allocator_type *)&linit);
  lVar22 = 0xb8;
  lVar25 = 0;
  for (lVar26 = 0; iVar27 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level,
      lVar26 <= iVar27; lVar26 = lVar26 + 1) {
    pGVar7 = (this->super_AmrCore).super_AmrMesh.geom.
             super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
             super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
             super__Vector_impl_data._M_start;
    uStack_360 = *(uint *)((long)(pGVar7->super_CoordSys).offset + lVar22 + 0xfffffffffffffff4U);
    _linit = *(ulong *)((long)(pGVar7->super_CoordSys).offset + lVar22 + 0xffffffffffffffecU);
    aoStack_358._4_4_ = *(undefined4 *)((long)(pGVar7->super_CoordSys).offset + lVar22);
    uVar8 = *(undefined8 *)((long)(pGVar7->super_CoordSys).offset + lVar22 + 0xfffffffffffffff8U);
    uStack_35c = (undefined4)uVar8;
    aoStack_358._0_4_ = (undefined4)((ulong)uVar8 >> 0x20);
    *(ulong *)((long)((inputs_domain.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                       super__Vector_impl_data._M_start)->bigend).vect + lVar25 + 4) =
         CONCAT44(aoStack_358._4_4_,aoStack_358._0_4_);
    puVar2 = (ulong *)((long)((inputs_domain.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                               super__Vector_impl_data._M_start)->smallend).vect + lVar25);
    *puVar2 = _linit;
    puVar2[1] = CONCAT44(uStack_35c,uStack_360);
    *(undefined4 *)
     ((long)&((IndexType *)
             (&(inputs_domain.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_start)->bigend + 1))->itype + lVar25) = 0;
    lVar22 = lVar22 + 200;
    lVar25 = lVar25 + 0x1c;
  }
  local_478 = (string *)puVar1;
  if (iVar27 < mx_lev) {
    if (*(int *)(ParallelContext::frames + 0xc) == 0) {
      Warning_host("Amr::restart(): max_level is lower than before");
      iVar27 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
    }
    if (*(int *)puVar1 < iVar27) {
      iVar27 = *(int *)puVar1;
    }
    *(int *)puVar1 = iVar27;
    local_479 = _Var19;
    Geometry::Geometry((Geometry *)&linit);
    faHeaderFullName._M_dataplus._M_p = (pointer)0x0;
    faHeaderFullName._M_string_length = (ulong)faHeaderFullName._M_string_length._4_4_ << 0x20;
    lVar25 = 0;
    for (lVar22 = 0; iVar28 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level,
        lVar22 <= iVar28; lVar22 = lVar22 + 1) {
      amrex::operator>>((istream *)&is,
                        (Geometry *)
                        ((long)(((this->super_AmrCore).super_AmrMesh.geom.
                                 super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                                 super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->super_CoordSys).offset
                        + lVar25 + 0xfffffffffffffff8U));
      lVar25 = lVar25 + 200;
    }
    iVar28 = iVar28 + -1;
    while (iVar28 = iVar28 + 1, iVar28 < mx_lev) {
      amrex::operator>>((istream *)&is,(Geometry *)&linit);
    }
    lVar25 = 0;
    for (lVar22 = 0; uVar29 = (ulong)(this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level,
        lVar22 < (long)uVar29; lVar22 = lVar22 + 1) {
      amrex::operator>>((istream *)&is,
                        (IntVect *)
                        ((long)((this->super_AmrCore).super_AmrMesh.super_AmrInfo.ref_ratio.
                                super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                                super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                                _M_impl.super__Vector_impl_data._M_start)->vect + lVar25));
      lVar25 = lVar25 + 0xc;
    }
    for (; (int)uVar29 < mx_lev; uVar29 = (ulong)((int)uVar29 + 1)) {
      amrex::operator>>((istream *)&is,(IntVect *)&faHeaderFullName);
    }
    for (lVar22 = 0; cVar18 = local_479,
        iVar28 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level, lVar22 <= iVar28;
        lVar22 = lVar22 + 1) {
      std::istream::_M_extract<double>((double *)&is);
    }
    iVar28 = iVar28 + -1;
    while (iVar28 = iVar28 + 1, iVar28 < mx_lev) {
      std::istream::_M_extract<double>((double *)&is);
    }
    if (cVar18 == '\0') {
      iVar28 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
      pdVar12 = (this->dt_level).super_vector<double,_std::allocator<double>_>.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      pdVar13 = (this->dt_min).super_vector<double,_std::allocator<double>_>.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      for (lVar22 = 0; lVar22 <= iVar28; lVar22 = lVar22 + 1) {
        pdVar13[lVar22] = pdVar12[lVar22];
      }
    }
    else {
      for (lVar22 = 0; iVar28 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level,
          lVar22 <= iVar28; lVar22 = lVar22 + 1) {
        std::istream::_M_extract<double>((double *)&is);
      }
      iVar28 = iVar28 + -1;
      while (iVar28 = iVar28 + 1, iVar28 < mx_lev) {
        std::istream::_M_extract<double>((double *)&is);
      }
    }
    lVar25 = 0;
    for (lVar22 = 0; iVar28 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level,
        lVar22 <= iVar28; lVar22 = lVar22 + 1) {
      std::istream::operator>>
                ((istream *)&is,
                 (int *)((long)(this->n_cycle).super_vector<int,_std::allocator<int>_>.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar25));
      lVar25 = lVar25 + 4;
    }
    iVar28 = iVar28 + -1;
    while (iVar28 = iVar28 + 1, iVar28 < mx_lev) {
      std::istream::operator>>((istream *)&is,&int_dummy);
    }
    lVar25 = 0;
    for (lVar22 = 0; iVar28 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level,
        lVar22 <= iVar28; lVar22 = lVar22 + 1) {
      std::istream::operator>>
                ((istream *)&is,
                 (int *)((long)(this->level_steps).super_vector<int,_std::allocator<int>_>.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar25));
      lVar25 = lVar25 + 4;
    }
    iVar28 = iVar28 + -1;
    while (iVar28 = iVar28 + 1, iVar28 < mx_lev) {
      std::istream::operator>>((istream *)&is,&int_dummy);
    }
    lVar25 = 0;
    for (lVar22 = 0; iVar28 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level,
        lVar22 <= iVar28; lVar22 = lVar22 + 1) {
      std::istream::operator>>
                ((istream *)&is,
                 (int *)((long)(this->level_count).super_vector<int,_std::allocator<int>_>.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar25));
      lVar25 = lVar25 + 4;
    }
    iVar28 = iVar28 + -1;
    while (iVar28 = iVar28 + 1, iVar28 < mx_lev) {
      std::istream::operator>>((istream *)&is,&int_dummy);
    }
    if (((anonymous_namespace)::regrid_on_restart != 0) &&
       (0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level)) {
      iVar28 = *(this->regrid_int).super_vector<int,_std::allocator<int>_>.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      if (iVar28 < 1) {
        Error_host("restart: can\'t have regrid_on_restart and regrid_int <= 0");
      }
      else {
        *(this->level_count).super_vector<int,_std::allocator<int>_>.
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
             iVar28;
      }
    }
    checkInput(this);
    for (lVar22 = 0; psVar30 = local_478, lVar22 <= iVar27; lVar22 = lVar22 + 1) {
      puVar14 = (this->amr_level).
                super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                .
                super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      _Var24.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
      super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
      super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
           (__uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>)
           (**(code **)(*(long *)this->levelbld + 0x28))();
      tVar15.super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
      super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
           *(_Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_> *)
            &puVar14[lVar22]._M_t.
             super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
      puVar14[lVar22]._M_t.
      super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> =
           _Var24.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t
           .super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
           super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl;
      if (tVar15.super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
          super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl !=
          (_Head_base<0UL,_amrex::AmrLevel_*,_false>)0x0) {
        (**(code **)(*(long *)tVar15.
                              super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                              .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 8))();
      }
      _Var24.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
      super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
      super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
           (this->amr_level).
           super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar22]._M_t.
           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
      (**(code **)(*(long *)_Var24.
                            super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                            .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x58))
                (_Var24.
                 super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
                 super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
                 super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,this,&is,0);
      AmrMesh::SetBoxArray
                ((AmrMesh *)this,(int)lVar22,
                 (BoxArray *)
                 ((long)(this->amr_level).
                        super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                        .
                        super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar22]._M_t.
                        super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                 + 0xd8));
      AmrMesh::SetDistributionMap
                ((AmrMesh *)this,(int)lVar22,
                 (DistributionMapping *)
                 ((long)(this->amr_level).
                        super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                        .
                        super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar22]._M_t.
                        super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                 + 0x140));
    }
    for (lVar22 = 0; lVar22 <= iVar27; lVar22 = lVar22 + 1) {
      (**(code **)(*(long *)(this->amr_level).
                            super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                            .
                            super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar22]._M_t.
                            super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                  + 0x90))();
    }
  }
  else {
    lVar25 = 0;
    for (lVar22 = 0; lVar22 <= mx_lev; lVar22 = lVar22 + 1) {
      amrex::operator>>((istream *)&is,
                        (Geometry *)
                        ((long)(((this->super_AmrCore).super_AmrMesh.geom.
                                 super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                                 super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->super_CoordSys).offset
                        + lVar25 + 0xfffffffffffffff8U));
      lVar25 = lVar25 + 200;
    }
    lVar25 = 0;
    for (lVar22 = 0; lVar22 < mx_lev; lVar22 = lVar22 + 1) {
      amrex::operator>>((istream *)&is,
                        (IntVect *)
                        ((long)((this->super_AmrCore).super_AmrMesh.super_AmrInfo.ref_ratio.
                                super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                                super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                                _M_impl.super__Vector_impl_data._M_start)->vect + lVar25));
      lVar25 = lVar25 + 0xc;
    }
    for (lVar22 = 0; lVar22 <= mx_lev; lVar22 = lVar22 + 1) {
      std::istream::_M_extract<double>((double *)&is);
    }
    if (_Var19) {
      for (lVar22 = 0; lVar22 <= mx_lev; lVar22 = lVar22 + 1) {
        std::istream::_M_extract<double>((double *)&is);
      }
    }
    else {
      pdVar12 = (this->dt_level).super_vector<double,_std::allocator<double>_>.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      pdVar13 = (this->dt_min).super_vector<double,_std::allocator<double>_>.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      for (lVar22 = 0; lVar22 <= mx_lev; lVar22 = lVar22 + 1) {
        pdVar13[lVar22] = pdVar12[lVar22];
      }
    }
    faHeaderFullName.field_2._M_allocated_capacity = 0;
    faHeaderFullName._M_dataplus._M_p = (pointer)0x0;
    faHeaderFullName._M_string_length = 0;
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)&faHeaderFullName,(long)(mx_lev + 1));
    lVar25 = 0;
    for (lVar22 = 0; uVar29 = (ulong)mx_lev, lVar22 <= (long)uVar29; lVar22 = lVar22 + 1) {
      std::istream::operator>>((istream *)&is,(int *)(faHeaderFullName._M_dataplus._M_p + lVar25));
      lVar25 = lVar25 + 4;
    }
    lVar22 = 0;
    bVar16 = 0;
    for (lVar25 = 0; psVar30 = local_478, lVar25 <= (int)uVar29; lVar25 = lVar25 + 1) {
      if (*(int *)((long)(this->n_cycle).super_vector<int,_std::allocator<int>_>.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar22) !=
          *(int *)(faHeaderFullName._M_dataplus._M_p + lVar22)) {
        bVar16 = 1;
        if (0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose) {
          poVar21 = OutStream();
          Print::Print((Print *)&linit,poVar21);
          std::operator<<(aoStack_358,"Warning: n_cycle has changed at level ");
          std::ostream::operator<<(aoStack_358,(int)lVar25);
          std::operator<<(aoStack_358," from ");
          pPVar23 = Print::operator<<((Print *)&linit,
                                      (int *)(faHeaderFullName._M_dataplus._M_p + lVar22));
          std::operator<<((ostream *)&pPVar23->ss," to ");
          pPVar23 = Print::operator<<(pPVar23,(int *)((long)(this->n_cycle).
                                                            super_vector<int,_std::allocator<int>_>.
                                                                                                                        
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + lVar22)
                                     );
          std::operator<<((ostream *)&pPVar23->ss,"\n");
          Print::~Print((Print *)&linit);
          uVar29 = (ulong)(uint)mx_lev;
        }
      }
      lVar22 = lVar22 + 4;
    }
    if (((bool)(0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level & bVar16)) &&
       (*(this->level_count).super_vector<int,_std::allocator<int>_>.
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
             *(this->regrid_int).super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       , 0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose)) {
      poVar21 = OutStream();
      Print::Print((Print *)&linit,poVar21);
      std::operator<<(aoStack_358,"Warning: This forces a full regrid \n");
      Print::~Print((Print *)&linit);
    }
    lVar25 = 0;
    for (lVar22 = 0; uVar29 = (ulong)mx_lev, lVar22 <= (long)uVar29; lVar22 = lVar22 + 1) {
      std::istream::operator>>
                ((istream *)&is,
                 (int *)((long)(this->level_steps).super_vector<int,_std::allocator<int>_>.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar25));
      lVar25 = lVar25 + 4;
    }
    lVar25 = 0;
    lVar22 = 0;
    while( true ) {
      lVar26 = (long)(int)uVar29;
      if (lVar26 < lVar22) break;
      std::istream::operator>>
                ((istream *)&is,
                 (int *)((long)(this->level_count).super_vector<int,_std::allocator<int>_>.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar25));
      lVar22 = lVar22 + 1;
      uVar29 = (ulong)(uint)mx_lev;
      lVar25 = lVar25 + 4;
    }
    iVar27 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
    if ((int)uVar29 < iVar27) {
      pdVar12 = (this->dt_level).super_vector<double,_std::allocator<double>_>.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      piVar9 = (this->level_steps).super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      piVar10 = (this->n_cycle).super_vector<int,_std::allocator<int>_>.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      piVar11 = (this->level_count).super_vector<int,_std::allocator<int>_>.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      for (; lVar26 < iVar27; lVar26 = lVar26 + 1) {
        iVar27 = piVar10[lVar26 + 1];
        pdVar12[lVar26 + 1] = pdVar12[lVar26] / (double)iVar27;
        piVar9[lVar26 + 1] = iVar27 * piVar9[lVar26];
        piVar11[lVar26 + 1] = 0;
        iVar27 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
      }
      if (this->sub_cycle == 0) {
        for (lVar22 = 1; lVar22 <= (int)*(uint *)psVar30; lVar22 = lVar22 + 1) {
          pdVar12 = (this->dt_level).super_vector<double,_std::allocator<double>_>.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          dVar6 = pdVar12[lVar22];
          pdVar4 = pdVar12 + lVar22 + -1;
          if ((dVar6 != *pdVar4) || (NAN(dVar6) || NAN(*pdVar4))) {
            Error_host("restart: must have same dt at all levels if not subcycling");
          }
        }
        iVar27 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
      }
    }
    if (((anonymous_namespace)::regrid_on_restart != 0) && (0 < iVar27)) {
      iVar27 = *(this->regrid_int).super_vector<int,_std::allocator<int>_>.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      if (iVar27 < 1) {
        Error_host("restart: can\'t have regrid_on_restart and regrid_int <= 0");
      }
      else {
        *(this->level_count).super_vector<int,_std::allocator<int>_>.
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
             iVar27;
      }
    }
    checkInput(this);
    for (lVar22 = 0; psVar30 = local_478, uVar29 = (ulong)(int)*(uint *)local_478,
        lVar22 <= (long)uVar29; lVar22 = lVar22 + 1) {
      puVar14 = (this->amr_level).
                super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                .
                super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      _Var24.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
      super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
      super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
           (__uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>)
           (**(code **)(*(long *)this->levelbld + 0x28))();
      tVar15.super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
      super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
           *(_Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_> *)
            &puVar14[lVar22]._M_t.
             super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
      puVar14[lVar22]._M_t.
      super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> =
           _Var24.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t
           .super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
           super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl;
      if (tVar15.super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
          super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl !=
          (_Head_base<0UL,_amrex::AmrLevel_*,_false>)0x0) {
        (**(code **)(*(long *)tVar15.
                              super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                              .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 8))();
      }
      _Var24.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
      super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
      super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
           (this->amr_level).
           super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar22]._M_t.
           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
      (**(code **)(*(long *)_Var24.
                            super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                            .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x58))
                (_Var24.
                 super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
                 super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
                 super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,this,&is,0);
      AmrMesh::SetBoxArray
                ((AmrMesh *)this,(int)lVar22,
                 (BoxArray *)
                 ((long)(this->amr_level).
                        super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                        .
                        super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar22]._M_t.
                        super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                 + 0xd8));
      AmrMesh::SetDistributionMap
                ((AmrMesh *)this,(int)lVar22,
                 (DistributionMapping *)
                 ((long)(this->amr_level).
                        super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                        .
                        super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar22]._M_t.
                        super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                 + 0x140));
    }
    for (lVar22 = 0; lVar22 <= (int)uVar29; lVar22 = lVar22 + 1) {
      (**(code **)(*(long *)(this->amr_level).
                            super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                            .
                            super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar22]._M_t.
                            super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                  + 0x90))();
      uVar29 = (ulong)*(uint *)psVar30;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&faHeaderFullName);
  }
  lVar22 = 0x53;
  for (lVar25 = 0; uVar29 = (ulong)(int)*(uint *)psVar30, lVar25 <= (long)uVar29;
      lVar25 = lVar25 + 1) {
    pGVar7 = (this->super_AmrCore).super_AmrMesh.geom.
             super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
             super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
             super__Vector_impl_data._M_start;
    _linit = (ulong)*(byte *)((long)(pGVar7->super_CoordSys).offset + lVar22 + 0xfffffffffffffff7U)
             << 0x20 | (ulong)*(byte *)((long)(pGVar7->super_CoordSys).offset +
                                       lVar22 + 0xfffffffffffffff6U);
    uStack_360 = (uint)*(byte *)((long)(pGVar7->super_CoordSys).offset +
                                lVar22 + 0xfffffffffffffff8U);
    Geometry::setPeriodicity
              ((Geometry *)
               ((long)(this->amr_level).
                      super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                      .
                      super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar25]._M_t.
                      super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
               + 0x10),(Array<int,_3> *)&linit);
    lVar22 = lVar22 + 200;
  }
  iVar27 = *(this->level_steps).super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  this->last_checkpoint = iVar27;
  this->last_plotfile = iVar27;
  lVar22 = 0xac;
  lVar25 = 0;
  for (lVar26 = 0; lVar26 <= (int)uVar29; lVar26 = lVar26 + 1) {
    pGVar7 = (this->super_AmrCore).super_AmrMesh.geom.
             super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
             super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
             super__Vector_impl_data._M_start;
    pRVar3 = (Real *)((long)(pGVar7->super_CoordSys).offset + lVar22 + 0xfffffffffffffff8U);
    real_dummy = *pRVar3;
    RVar17 = pRVar3[1];
    puVar5 = (undefined8 *)((long)(pGVar7->super_CoordSys).offset + lVar22 + 4U);
    aStack_3f8._4_8_ = puVar5[1];
    aStack_3f8._M_allocated_capacity._0_4_ = (undefined4)((ulong)*puVar5 >> 0x20);
    iStack_400 = SUB84(RVar17,0);
    iStack_3fc = (int)((ulong)RVar17 >> 0x20);
    bVar20 = Box::operator==((Box *)((long)((inputs_domain.
                                             super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->smallend).
                                           vect + lVar25),(Box *)&real_dummy);
    if (!bVar20) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&linit);
      poVar21 = std::operator<<((ostream *)&linit,"Problem at level ");
      poVar21 = (ostream *)std::ostream::operator<<(poVar21,(int)lVar26);
      poVar21 = std::operator<<(poVar21,'\n');
      poVar21 = std::operator<<(poVar21,"Domain according to     inputs file is ");
      poVar21 = amrex::operator<<(poVar21,(Box *)((long)((inputs_domain.
                                                                                                                    
                                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                                                  .
                                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  smallend).vect + lVar25));
      poVar21 = std::operator<<(poVar21,'\n');
      poVar21 = std::operator<<(poVar21,"Domain according to checkpoint file is ");
      poVar21 = amrex::operator<<(poVar21,(Box *)&real_dummy);
      poVar21 = std::operator<<(poVar21,'\n');
      poVar21 = std::operator<<(poVar21,"Amr::restart() failed -- box from inputs file does not ");
      std::operator<<(poVar21,"equal box from restart file. \n");
      std::__cxx11::stringbuf::str();
      Abort(&faHeaderFullName);
      std::__cxx11::string::~string((string *)&faHeaderFullName);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&linit);
    }
    uVar29 = (ulong)*(uint *)local_478;
    lVar22 = lVar22 + 200;
    lVar25 = lVar25 + 0x1c;
  }
  if (0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose) {
    local_478 = (string *)second();
    poVar21 = OutStream();
    Print::Print((Print *)&linit,poVar21);
    std::operator<<(aoStack_358,"Restart time = ");
    std::ostream::_M_insert<double>((double)local_478 - local_3e8);
    std::operator<<(aoStack_358," seconds.");
    std::operator<<(aoStack_358,'\n');
    Print::~Print((Print *)&linit);
  }
  std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
            ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&inputs_domain);
  std::__cxx11::string::~string((string *)&first_line);
  std::__cxx11::istringstream::~istringstream((istringstream *)&is);
  std::__cxx11::string::~string((string *)&fileCharPtrString);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)&fileCharPtr);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)&io_buffer);
  std::__cxx11::string::~string((string *)&File);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&faHeaderMap._M_t);
  return;
}

Assistant:

void
Amr::restart (const std::string& filename)
{
    BL_PROFILE_REGION_START("Amr::restart()");
    BL_PROFILE("Amr::restart()");

    which_level_being_advanced = -1;

    auto dRestartTime0 = amrex::second();

    VisMF::SetMFFileInStreams(mffile_nstreams);

    if (verbose > 0) {
        amrex::Print() << "restarting calculation from file: " << filename << "\n";
    }

    if (record_run_info && ParallelDescriptor::IOProcessor()) {
        runlog << "RESTART from file = " << filename << '\n';
    }
    //
    // Init problem dependent data.
    //

#ifndef AMREX_NO_PROBINIT
    if (!probin_file.empty()) {
        int linit = false;
        readProbinFile(linit);
    }
#endif

    //
    // Start calculation from given restart file.
    //
    if (record_run_info && ParallelDescriptor::IOProcessor()) {
        runlog << "RESTART from file = " << filename << '\n';
    }

    // ---- preread and broadcast all FabArray headers if this file exists
    std::map<std::string, Vector<char> > faHeaderMap;
    if(prereadFAHeaders) {
      // ---- broadcast the file with the names of the fabarray headers
      std::string faHeaderFilesName(filename + "/FabArrayHeaders.txt");
      Vector<char> faHeaderFileChars;
      bool bExitOnError(false);  // ---- dont exit if this file does not exist
      ParallelDescriptor::ReadAndBcastFile(faHeaderFilesName, faHeaderFileChars,
                                           bExitOnError);
      if(faHeaderFileChars.size() > 0) {  // ---- headers were read
        std::string faFileCharPtrString(faHeaderFileChars.dataPtr());
        std::istringstream fais(faFileCharPtrString, std::istringstream::in);
        while ( ! fais.eof()) {  // ---- read and broadcast each header
          std::string faHeaderName;
          fais >> faHeaderName;
          if( ! fais.eof()) {
              std::string faHeaderFullName(filename + '/' + faHeaderName + "_H");
              Vector<char> &tempCharArray = faHeaderMap[faHeaderFullName];
              ParallelDescriptor::ReadAndBcastFile(faHeaderFullName, tempCharArray);
              if(verbose > 2) {
                  amrex::Print()
                      << ":::: faHeaderName faHeaderFullName tempCharArray.size() = " << faHeaderName
                      << "  " << faHeaderFullName << "  " << tempCharArray.size() << "\n";
              }
          }
        }
        StateData::SetFAHeaderMapPtr(&faHeaderMap);
      }
    }

    //
    // Open the checkpoint header file for reading.
    //
    std::string File(filename + "/Header");

    VisMF::IO_Buffer io_buffer(VisMF::GetIOBufferSize());

    Vector<char> fileCharPtr;
    ParallelDescriptor::ReadAndBcastFile(File, fileCharPtr);
    std::string fileCharPtrString(fileCharPtr.dataPtr());
    std::istringstream is(fileCharPtrString, std::istringstream::in);
    //
    // Read global data.
    //
    // Attempt to differentiate between old and new CheckPointFiles.
    //
    int         spdim;
    bool        new_checkpoint_format = false;
    std::string first_line;

    std::getline(is,first_line);

    if (first_line == CheckPointVersion)
    {
        new_checkpoint_format = true;
        is >> spdim;
    }
    else
    {
        spdim = atoi(first_line.c_str());
    }

    if (spdim != AMREX_SPACEDIM)
    {
        amrex::ErrorStream() << "Amr::restart(): bad spacedim = " << spdim << '\n';
        amrex::Abort();
    }

    is >> cumtime;
    int mx_lev;
    is >> mx_lev;
    is >> finest_level;

    Vector<Box> inputs_domain(max_level+1);
    for (int lev = 0; lev <= max_level; ++lev)
    {
        Box bx(Geom(lev).Domain().smallEnd(),Geom(lev).Domain().bigEnd());
        inputs_domain[lev] = bx;
    }

    if (max_level >= mx_lev) {

       for (int i(0); i <= mx_lev; ++i) { is >> Geom(i);      }
       for (int i(0); i <  mx_lev; ++i) { is >> ref_ratio[i]; }
       for (int i(0); i <= mx_lev; ++i) { is >> dt_level[i];  }

       if (new_checkpoint_format)
       {
           for (int i(0); i <= mx_lev; ++i) { is >> dt_min[i]; }
       }
       else
       {
           for (int i(0); i <= mx_lev; ++i) { dt_min[i] = dt_level[i]; }
       }

       Vector<int>  n_cycle_in;
       n_cycle_in.resize(mx_lev+1);
       for (int i(0); i <= mx_lev; ++i) { is >> n_cycle_in[i]; }
       bool any_changed = false;

       for (int i(0); i <= mx_lev; ++i) {
           if (n_cycle[i] != n_cycle_in[i]) {
               any_changed = true;
               if (verbose > 0) {
                   amrex::Print() << "Warning: n_cycle has changed at level " << i <<
                       " from " << n_cycle_in[i] << " to " << n_cycle[i] << "\n";
               }
           }
       }

       // If we change n_cycle then force a full regrid from level 0 up
       if (max_level > 0 && any_changed)
       {
           level_count[0] = regrid_int[0];
           if (verbose > 0) {
               amrex::Print() << "Warning: This forces a full regrid \n";
           }
       }


       for (int i(0); i <= mx_lev; ++i) { is >> level_steps[i]; }
       for (int i(0); i <= mx_lev; ++i) { is >> level_count[i]; }

       //
       // Set bndry conditions.
       //
       if (max_level > mx_lev)
       {
           for (int i(mx_lev + 1); i <= max_level; ++i)
           {
               dt_level[i]    = dt_level[i-1]/n_cycle[i];
               level_steps[i] = n_cycle[i]*level_steps[i-1];
               level_count[i] = 0;
           }

           // This is just an error check
           if ( ! sub_cycle)
           {
               for (int i(1); i <= finest_level; ++i)
               {
                   if (dt_level[i] != dt_level[i-1]) {
                       amrex::Error("restart: must have same dt at all levels if not subcycling");
                   }
               }
           }
       }

       if (regrid_on_restart && max_level > 0)
       {
           if (regrid_int[0] > 0) {
               level_count[0] = regrid_int[0];
           } else {
               amrex::Error("restart: can't have regrid_on_restart and regrid_int <= 0");
           }
       }

       checkInput();
       //
       // Read levels.
       //
       for (int lev(0); lev <= finest_level; ++lev)
       {
           amr_level[lev].reset((*levelbld)());
           amr_level[lev]->restart(*this, is);
           this->SetBoxArray(lev, amr_level[lev]->boxArray());
           this->SetDistributionMap(lev, amr_level[lev]->DistributionMap());
       }
       //
       // Build any additional data structures.
       //
       for (int lev = 0; lev <= finest_level; lev++) {
           amr_level[lev]->post_restart();
       }

    } else {

       if (ParallelDescriptor::IOProcessor()) {
          amrex::Warning("Amr::restart(): max_level is lower than before");
       }

       int new_finest_level = std::min(max_level,finest_level);

       finest_level = new_finest_level;

       // These are just used to hold the extra stuff we have to read in.
       Geometry   geom_dummy;
       Real       real_dummy;
       int         int_dummy;
       IntVect intvect_dummy;

       for (int i(0)            ; i <= max_level; ++i) { is >> Geom(i); }
       for (int i(max_level + 1); i <= mx_lev   ; ++i) { is >> geom_dummy; }

       for (int i(0)        ; i <  max_level; ++i) { is >> ref_ratio[i]; }
       for (int i(max_level); i <  mx_lev   ; ++i) { is >> intvect_dummy; }

       for (int i(0)            ; i <= max_level; ++i) { is >> dt_level[i]; }
       for (int i(max_level + 1); i <= mx_lev   ; ++i) { is >> real_dummy; }

       if (new_checkpoint_format) {
           for (int i(0)            ; i <= max_level; ++i) { is >> dt_min[i]; }
           for (int i(max_level + 1); i <= mx_lev   ; ++i) { is >> real_dummy; }
       } else {
           for (int i(0); i <= max_level; ++i) { dt_min[i] = dt_level[i]; }
       }

       for (int i(0)            ; i <= max_level; ++i) { is >> n_cycle[i]; }
       for (int i(max_level + 1); i <= mx_lev   ; ++i) { is >> int_dummy; }

       for (int i(0)            ; i <= max_level; ++i) { is >> level_steps[i]; }
       for (int i(max_level + 1); i <= mx_lev   ; ++i) { is >> int_dummy; }

       for (int i(0)            ; i <= max_level; ++i) { is >> level_count[i]; }
       for (int i(max_level + 1); i <= mx_lev   ; ++i) { is >> int_dummy; }

       if (regrid_on_restart && max_level > 0) {
           if (regrid_int[0] > 0)  {
               level_count[0] = regrid_int[0];
           } else {
               amrex::Error("restart: can't have regrid_on_restart and regrid_int <= 0");
           }
       }

       checkInput();

       //
       // Read levels.
       //
       for (int lev = 0; lev <= new_finest_level; lev++)
       {
           amr_level[lev].reset((*levelbld)());
           amr_level[lev]->restart(*this, is);
           this->SetBoxArray(lev, amr_level[lev]->boxArray());
           this->SetDistributionMap(lev, amr_level[lev]->DistributionMap());
       }
       //
       // Build any additional data structures.
       //
       for (int lev = 0; lev <= new_finest_level; lev++) {
           amr_level[lev]->post_restart();
       }
    }

    // Old checkpoints do not store isPeriodic.
    // So we have to set it after restart.
    for (int lev = 0; lev <= finest_level; ++lev)
    {
        amr_level[lev]->geom.setPeriodicity(Geom(lev).isPeriodic());
    }

    // Save the number of steps taken so far. This mainly
    // helps in the edge case where we end up not taking
    // any timesteps before the run terminates, so that
    // we know not to unnecessarily overwrite the old file.
    last_checkpoint = level_steps[0];
    last_plotfile = level_steps[0];

    for (int lev = 0; lev <= finest_level; ++lev)
    {
        Box restart_domain(Geom(lev).Domain());
        if ( ! (inputs_domain[lev] == restart_domain) )
        {
            std::ostringstream ss;
            ss  << "Problem at level " << lev << '\n'
                << "Domain according to     inputs file is " <<  inputs_domain[lev] << '\n'
                << "Domain according to checkpoint file is " << restart_domain      << '\n'
                << "Amr::restart() failed -- box from inputs file does not "
                << "equal box from restart file. \n";
            amrex::Abort(ss.str());
        }
    }

    if (verbose > 0)
    {
        auto dRestartTime = amrex::second() - dRestartTime0;

        ParallelDescriptor::ReduceRealMax(dRestartTime,ParallelDescriptor::IOProcessorNumber());

        amrex::Print() << "Restart time = " << dRestartTime << " seconds." << '\n';
    }
    BL_PROFILE_REGION_STOP("Amr::restart()");
}